

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

string * __thiscall
google::protobuf::anon_unknown_24::SourceLocationCommentPrinter::FormatComment
          (string *__return_storage_ptr__,SourceLocationCommentPrinter *this,string *comment_text)

{
  string_view format;
  string stripped_comment;
  const_iterator __begin3;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_d8;
  Arg local_c0;
  const_iterator __end3;
  Arg local_60;
  
  std::__cxx11::string::string((string *)&stripped_comment,(string *)comment_text);
  absl::lts_20250127::StripAsciiWhitespace(&stripped_comment);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_d8.text_._M_len = stripped_comment._M_string_length;
  local_d8.text_._M_str = stripped_comment._M_dataplus._M_p;
  local_d8.delimiter_.c_ = '\n';
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::begin(&__begin3,&local_d8);
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::end(&__end3,&local_d8);
  while ((__begin3.state_ != __end3.state_ || (__begin3.pos_ != __end3.pos_))) {
    local_c0.piece_._M_str = (this->prefix_)._M_dataplus._M_p;
    local_c0.piece_._M_len = (this->prefix_)._M_string_length;
    local_60.piece_._M_len = __begin3.curr_._M_len;
    local_60.piece_._M_str = __begin3.curr_._M_str;
    format._M_str = "$0// $1\n";
    format._M_len = 8;
    absl::lts_20250127::SubstituteAndAppend(__return_storage_ptr__,format,&local_c0,&local_60);
    absl::lts_20250127::strings_internal::
    SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator++(&__begin3);
  }
  std::__cxx11::string::~string((string *)&stripped_comment);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatComment(const std::string& comment_text) {
    std::string stripped_comment = comment_text;
    absl::StripAsciiWhitespace(&stripped_comment);
    std::string output;
    for (absl::string_view line : absl::StrSplit(stripped_comment, '\n')) {
      absl::SubstituteAndAppend(&output, "$0// $1\n", prefix_, line);
    }
    return output;
  }